

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.h
# Opt level: O2

void __thiscall soul::Structure::Structure(Structure *this,Structure *param_1)

{
  (this->super_RefCountedObject).refCount = 0;
  this->backlinkToASTObject = param_1->backlinkToASTObject;
  this->activeUseFlag = param_1->activeUseFlag;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::ArrayWithPreallocation
            (&this->members,&param_1->members);
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->memberIndexMap)._M_h,&(param_1->memberIndexMap)._M_h);
  return;
}

Assistant:

Structure (const Structure&) = default;